

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenu::internalDelayedPopup(QMenu *this)

{
  QMenuPrivate *this_00;
  Data *pDVar1;
  int *piVar2;
  int iVar3;
  char cVar4;
  int iVar5;
  LayoutDirection LVar6;
  long lVar7;
  QObject *pQVar8;
  Data *pDVar9;
  undefined8 uVar10;
  QMenu *pQVar11;
  QGraphicsProxyWidget *pQVar12;
  QScreen *screen;
  QStyle *pQVar13;
  long in_FS_OFFSET;
  QRect QVar14;
  QPoint subMenuPos;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [8];
  QAction **local_50;
  long local_48;
  QPoint local_40;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  pDVar9 = (this_00->activeMenu).wp.d;
  if ((pDVar9 == (Data *)0x0) || (*(int *)(pDVar9 + 4) == 0)) {
    pQVar8 = (QObject *)0x0;
  }
  else {
    pQVar8 = (this_00->activeMenu).wp.value;
  }
  if ((pQVar8 != (QObject *)0x0) &&
     (*(QAction **)(*(long *)((this_00->activeMenu).wp.value + 8) + 0x3a8) != this_00->currentAction
     )) {
    QMenuPrivate::hideMenu(this_00,(QMenu *)pQVar8);
  }
  if ((this_00->currentAction == (QAction *)0x0) || (cVar4 = QAction::isEnabled(), cVar4 == '\0'))
  goto LAB_0045ef47;
  QAction::menuObject();
  lVar7 = QMetaObject::cast((QObject *)&staticMetaObject);
  if (lVar7 == 0) goto LAB_0045ef47;
  QAction::menuObject();
  lVar7 = QMetaObject::cast((QObject *)&staticMetaObject);
  if ((*(byte *)(*(long *)(lVar7 + 0x20) + 8) & 1) != 0) goto LAB_0045ef47;
  QAction::menuObject();
  lVar7 = QMetaObject::cast((QObject *)&staticMetaObject);
  if ((*(byte *)(*(long *)(lVar7 + 0x20) + 9) & 0x80) != 0) goto LAB_0045ef47;
  QAction::menuObject();
  pQVar8 = (QObject *)QMetaObject::cast((QObject *)&staticMetaObject);
  if (pQVar8 == (QObject *)0x0) {
    pDVar9 = (Data *)0x0;
  }
  else {
    pDVar9 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar8);
  }
  pDVar1 = (this_00->activeMenu).wp.d;
  (this_00->activeMenu).wp.d = pDVar9;
  (this_00->activeMenu).wp.value = pQVar8;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  lVar7 = *(long *)((this_00->activeMenu).wp.value + 8);
  uVar10 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
  piVar2 = *(int **)(lVar7 + 0x2f8);
  *(undefined8 *)(lVar7 + 0x2f8) = uVar10;
  *(QMenu **)(lVar7 + 0x300) = this;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  pQVar8 = (QObject *)this_00->currentAction;
  lVar7 = *(long *)((this_00->activeMenu).wp.value + 8);
  if (pQVar8 == (QObject *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar8);
  }
  piVar2 = *(int **)(lVar7 + 0x308);
  *(undefined8 *)(lVar7 + 0x308) = uVar10;
  *(QObject **)(lVar7 + 0x310) = pQVar8;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      operator_delete(piVar2);
    }
  }
  pQVar11 = this;
  if (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 0x20000000) == 0) {
    do {
      pQVar11 = *(QMenu **)(*(long *)&(pQVar11->super_QWidget).field_0x8 + 0x10);
      if (pQVar11 == (QMenu *)0x0) goto LAB_0045ed6d;
    } while (((((pQVar11->super_QWidget).data)->window_flags).
              super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>.i &
             0x20000000) == 0);
    if (pQVar11 != (QMenu *)0x0) goto LAB_0045ed81;
LAB_0045ed6d:
    pQVar12 = QWidgetPrivate::nearestGraphicsProxyWidget(&this->super_QWidget);
    if (pQVar12 == (QGraphicsProxyWidget *)0x0) goto LAB_0045ed81;
    screen = (QScreen *)0x0;
  }
  else {
LAB_0045ed81:
    local_58 = (undefined1  [8])QWidget::pos(&this->super_QWidget);
    screen = (QScreen *)QGuiApplication::screenAt((QPoint *)local_58);
  }
  QVar14 = QMenuPrivate::popupGeometry(this_00,screen);
  pQVar13 = QWidget::style(&this->super_QWidget);
  iVar5 = (**(code **)(*(long *)pQVar13 + 0xe0))(pQVar13,0x57,0,this);
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (undefined1  [16])QMenuPrivate::actionRect(this_00,this_00->currentAction);
  LVar6 = QWidget::layoutDirection(&this->super_QWidget);
  iVar3 = (local_38._0_4_ - local_38._8_4_) - iVar5;
  if (LVar6 != RightToLeft) {
    iVar3 = iVar5;
  }
  local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_58._4_4_ = local_38._4_4_;
  local_58._0_4_ = iVar3 + local_38._8_4_;
  local_40 = QWidget::mapToGlobal(&this->super_QWidget,(QPoint *)local_58);
  if (QVar14.x2.m_i.m_i < local_40.xp.m_i.m_i) {
    local_40.xp.m_i = (((this->super_QWidget).data)->crect).x1.m_i;
  }
  QWidget::actions((QList<QAction_*> *)local_58,(QWidget *)(this_00->activeMenu).wp.value);
  if (local_48 != 0) {
    QVar14 = QMenuPrivate::actionRect
                       (*(QMenuPrivate **)((this_00->activeMenu).wp.value + 8),*local_50);
    local_40.yp.m_i = local_40.yp.m_i - QVar14.y1.m_i;
  }
  pQVar8 = (QObject *)0x0;
  popup((QMenu *)(this_00->activeMenu).wp.value,&local_40,(QAction *)0x0);
  pDVar9 = (this_00->activeMenu).wp.d;
  if (pDVar9 != (Data *)0x0) {
    if (*(int *)(pDVar9 + 4) == 0) {
      pQVar8 = (QObject *)0x0;
    }
    else {
      pQVar8 = (this_00->activeMenu).wp.value;
    }
  }
  QMenuSloppyState::setSubMenuPopup
            (&this_00->sloppyState,(QRect *)local_38,this_00->currentAction,(QMenu *)pQVar8);
  if ((((this->super_QWidget).data)->widget_attributes & 2) != 0) {
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_68,Leave);
    QCoreApplication::sendEvent((QObject *)this,(QEvent *)&local_68);
    QEvent::~QEvent((QEvent *)&local_68);
  }
  if ((QPoint)local_58 != (QPoint)0x0) {
    LOCK();
    *(int *)local_58 = *(int *)local_58 + -1;
    UNLOCK();
    if (*(int *)local_58 == 0) {
      QArrayData::deallocate((QArrayData *)local_58,8,0x10);
    }
  }
LAB_0045ef47:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::internalDelayedPopup()
{
    Q_D(QMenu);
    //hide the current item
    if (QMenu *menu = d->activeMenu) {
        if (d->activeMenu->menuAction() != d->currentAction)
            d->hideMenu(menu);
    }

    if (!d->currentAction || !d->currentAction->isEnabled() || !d->currentAction->menu() ||
        !d->currentAction->menu()->isEnabled() || d->currentAction->menu()->isVisible())
        return;

    //setup
    d->activeMenu = d->currentAction->menu();
    d->activeMenu->d_func()->causedPopup.widget = this;
    d->activeMenu->d_func()->causedPopup.action = d->currentAction;

    QRect screen;
#if QT_CONFIG(graphicsview)
    bool isEmbedded = !bypassGraphicsProxyWidget(this) && QMenuPrivate::nearestGraphicsProxyWidget(this);
    if (isEmbedded)
        screen = d->popupGeometry();
    else
#endif
    screen = d->popupGeometry(QGuiApplication::screenAt(pos()));

    int subMenuOffset = style()->pixelMetric(QStyle::PM_SubMenuOverlap, nullptr, this);
    const QRect actionRect(d->actionRect(d->currentAction));
    const auto ofs = isRightToLeft() ? (-subMenuOffset - actionRect.width() + 1) : subMenuOffset;
    QPoint subMenuPos(mapToGlobal(QPoint(actionRect.right() + ofs, actionRect.top())));
    if (subMenuPos.x() > screen.right())
        subMenuPos.setX(geometry().left());

    const auto &subMenuActions = d->activeMenu->actions();
    if (!subMenuActions.isEmpty()) {
        // Offset by the submenu's 1st action position to align with the current action
        const auto subMenuActionRect = d->activeMenu->actionGeometry(subMenuActions.first());
        subMenuPos.ry() -= subMenuActionRect.top();
    }

    d->activeMenu->popup(subMenuPos);
    d->sloppyState.setSubMenuPopup(actionRect, d->currentAction, d->activeMenu);

#if !defined(Q_OS_DARWIN)
    // Send the leave event to the current menu - only active popup menu gets
    // mouse enter/leave events. Currently Cocoa is an exception, so disable
    // it there to avoid event duplication.
    if (underMouse()) {
        QEvent leaveEvent(QEvent::Leave);
        QCoreApplication::sendEvent(this, &leaveEvent);
    }
#endif
}